

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

int telnet_raw_vprintf(telnet_t *telnet,char *fmt,__va_list_tag *va)

{
  uint uVar1;
  char *pcVar2;
  int *piVar3;
  va_list va_temp;
  char buffer [1024];
  
  va_temp[0].gp_offset = va->gp_offset;
  va_temp[0].fp_offset = va->fp_offset;
  va_temp[0].overflow_arg_area = va->overflow_arg_area;
  va_temp[0].reg_save_area = va->reg_save_area;
  uVar1 = vsnprintf(buffer,0x400,fmt,va_temp);
  pcVar2 = buffer;
  if (0x3ff < uVar1) {
    pcVar2 = (char *)malloc((ulong)(uVar1 + 1));
    if (pcVar2 == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      _error(telnet,0x6ad,"telnet_raw_vprintf",TELNET_ENOMEM,0,"malloc() failed: %s",pcVar2);
      return -1;
    }
    va_temp[0].reg_save_area = va->reg_save_area;
    va_temp[0].gp_offset = va->gp_offset;
    va_temp[0].fp_offset = va->fp_offset;
    va_temp[0].overflow_arg_area = va->overflow_arg_area;
    uVar1 = vsnprintf(pcVar2,(ulong)(uVar1 + 1),fmt,va_temp);
  }
  telnet_send(telnet,pcVar2,(ulong)uVar1);
  if (pcVar2 != buffer) {
    free(pcVar2);
  }
  return uVar1;
}

Assistant:

int telnet_raw_vprintf(telnet_t *telnet, const char *fmt, va_list va) {
	va_list va_temp;
	char buffer[1024];
	char *output = buffer;
	unsigned int rs;

	/* format; allocate more space if necessary */
	va_copy(va_temp, va);
	rs = vsnprintf(buffer, sizeof(buffer), fmt, va_temp);
	va_end(va_temp);

	if (rs >= sizeof(buffer)) {
		output = (char*)malloc(rs + 1);
		if (output == 0) {
			_error(telnet, __LINE__, __func__, TELNET_ENOMEM, 0,
					"malloc() failed: %s", strerror(errno));
			return -1;
		}

		va_copy(va_temp, va);
		rs = vsnprintf(output, rs + 1, fmt, va_temp);
		va_end(va_temp);
	}

	/* send out the formatted data */
	telnet_send(telnet, output, rs);

	/* release allocated memory, if any */
	if (output != buffer) {
		free(output);
	}

	return rs;
}